

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

_Bool sesschan_set_env(Channel *chan,ptrlen var,ptrlen value)

{
  char *secondary;
  char *value_00;
  
  secondary = mkstr(var);
  value_00 = mkstr(value);
  conf_set_str_str((Conf *)chan[-0x5c].vt,0x38,secondary,value_00);
  safefree(secondary);
  safefree(value_00);
  return true;
}

Assistant:

bool sesschan_set_env(Channel *chan, ptrlen var, ptrlen value)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    char *svar = mkstr(var), *svalue = mkstr(value);
    conf_set_str_str(sess->conf, CONF_environmt, svar, svalue);
    sfree(svar);
    sfree(svalue);

    return true;
}